

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-sampling.cpp
# Opt level: O3

void test_xtc(vector<float,_std::allocator<float>_> *probs,
             vector<float,_std::allocator<float>_> *probs_expected,float p,float t)

{
  undefined8 uVar1;
  sampler_tester tester;
  sampler_tester local_58;
  
  sampler_tester::sampler_tester(&local_58,probs,probs_expected);
  printf("%s:%d (%s)\n",
         "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/tests/test-sampling.cpp"
         ,0x7a,"test_xtc");
  dump(&local_58.cur_p);
  puts("-");
  uVar1 = llama_sampler_init_xtc(0x3f7d70a4,p,0,0);
  llama_sampler_apply(uVar1,&local_58);
  llama_sampler_free(uVar1);
  printf("%s:%d (%s)\n",
         "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/tests/test-sampling.cpp"
         ,0x7c,"test_xtc");
  dump(&local_58.cur_p);
  puts("-");
  sampler_tester::check(&local_58);
  if (local_58.cur.super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.cur.
                    super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.cur.
                          super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.cur.
                          super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_58.probs_expected.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.probs_expected.super__Vector_base<float,_std::allocator<float>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.probs_expected.super__Vector_base<float,_std::allocator<float>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.probs_expected.super__Vector_base<float,_std::allocator<float>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void test_xtc(const std::vector<float> & probs, const std::vector<float> & probs_expected, float p, float t) {
    sampler_tester tester(probs, probs_expected);

    DUMP(&tester.cur_p);
    tester.apply(llama_sampler_init_xtc(p, t, 0, 0));
    DUMP(&tester.cur_p);

    tester.check();
}